

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void resolveRelocationAndSmartSmc(aint immediateOffset,EType minType)

{
  bool bVar1;
  size_type sVar2;
  reference this;
  reference pvVar3;
  value_type *smartSmc;
  EType minType_local;
  aint immediateOffset_local;
  
  Relocation::resolveRelocationAffected(immediateOffset,minType);
  if ((((immediateOffset != 0x7fffffff) &&
       (bVar1 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack),
       !bVar1)) && (smartSmcIndex != 0)) &&
     ((sVar2 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::size(&smartSmcLines),
      smartSmcIndex <= sVar2 &&
      (this = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at
                        (&smartSmcLines,smartSmcIndex - 1), this->colBegin == 0xffffffff)))) {
    pvVar3 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    bVar1 = TextFilePos::operator!=(this,pvVar3);
    if ((!bVar1) &&
       (pvVar3 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack),
       pvVar3->colBegin < 2)) {
      this->colBegin = immediateOffset;
    }
  }
  return;
}

Assistant:

void resolveRelocationAndSmartSmc(const aint immediateOffset, Relocation::EType minType) {
	// call relocation data generator to do its own errands
	Relocation::resolveRelocationAffected(immediateOffset, minType);
	// check smart-SMC functionality, if there is unresolved record to be set up
	if (INT_MAX == immediateOffset || sourcePosStack.empty() || 0 == smartSmcIndex) return;
	if (smartSmcLines.size() < smartSmcIndex) return;
	auto & smartSmc = smartSmcLines.at(smartSmcIndex - 1);
	if (~0U != smartSmc.colBegin || smartSmc != sourcePosStack.back()) return;
	if (1 < sourcePosStack.back().colBegin) return;		// only first segment belongs to SMC label
	// record does match current line, resolve the smart offset
	smartSmc.colBegin = immediateOffset;
}